

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O1

bool units::cleanUnitString(string *unit_string,uint64_t match_flags)

{
  byte *pbVar1;
  byte *pbVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  char cVar4;
  pointer pcVar5;
  long lVar6;
  _Alloc_hider __nptr;
  bool bVar7;
  uint uVar8;
  int iVar9;
  uint uVar10;
  size_type sVar11;
  size_t sVar12;
  size_type sVar13;
  size_t sVar14;
  void *pvVar15;
  size_type sVar16;
  uint *puVar17;
  undefined8 uVar18;
  const_iterator cVar19;
  char cVar20;
  char *pcVar21;
  char extraout_DL;
  pointer extraout_RDX;
  pointer extraout_RDX_00;
  pointer extraout_RDX_01;
  pointer extraout_RDX_02;
  pointer pcVar22;
  pointer extraout_RDX_03;
  pointer extraout_RDX_04;
  byte *pbVar23;
  size_t sVar24;
  ulong uVar25;
  pointer pcVar26;
  char *pcVar27;
  byte *pbVar28;
  char *pcVar29;
  long lVar30;
  size_t *in_R9;
  char *__data_1;
  byte bVar31;
  byte bVar32;
  bool bVar33;
  pointer pcVar34;
  size_type __size;
  ulong uVar35;
  ulong uVar36;
  size_type sVar37;
  int iVar38;
  char *__data;
  ulong __pos;
  bool bVar39;
  bool bVar40;
  bool bVar41;
  bool bVar42;
  double dVar43;
  precise_unit pVar44;
  precise_unit pVar45;
  size_t reploc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> str;
  bool local_5a9;
  uint local_598;
  size_type local_590;
  undefined1 local_582;
  undefined1 local_581;
  char *local_580;
  size_type local_578;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_570 [4];
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_470;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_430;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_3f0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_3b0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_370;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_330;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_2f0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_2b0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_270;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_230;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1f0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1b0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_170;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_130;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_f0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_b0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_70;
  
  local_578 = unit_string->_M_string_length;
  if ((cleanUnitString(std::__cxx11::string&,unsigned_long)::spchar_abi_cxx11_ == '\0') &&
     (iVar9 = __cxa_guard_acquire(&cleanUnitString(std::__cxx11::string&,unsigned_long)::
                                   spchar_abi_cxx11_), iVar9 != 0)) {
    paVar3 = &local_570[0].first.field_2;
    local_570[0].first._M_dataplus._M_p = (pointer)paVar3;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_570," \t\n\r","");
    std::operator+(&cleanUnitString(std::__cxx11::string&,unsigned_long)::spchar_abi_cxx11_,
                   &local_570[0].first,'\0');
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_570[0].first._M_dataplus._M_p != paVar3) {
      operator_delete(local_570[0].first._M_dataplus._M_p,
                      local_570[0].first.field_2._M_allocated_capacity + 1);
    }
    __cxa_atexit(std::__cxx11::string::~string,
                 &cleanUnitString(std::__cxx11::string&,unsigned_long)::spchar_abi_cxx11_,
                 &__dso_handle);
    __cxa_guard_release(&cleanUnitString(std::__cxx11::string&,unsigned_long)::spchar_abi_cxx11_);
  }
  bVar7 = false;
  uVar8 = (byte)(unit_string->_M_dataplus)._M_p[unit_string->_M_string_length - 1] - 0x2a;
  if ((uVar8 < 0x35) && ((0x10000000000021U >> ((ulong)uVar8 & 0x3f) & 1) != 0)) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::pop_back
              (unit_string);
    bVar7 = true;
  }
  sVar11 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
           find_first_not_of((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             unit_string,
                             cleanUnitString(std::__cxx11::string&,unsigned_long)::spchar_abi_cxx11_
                             ._M_dataplus._M_p,0,
                             cleanUnitString(std::__cxx11::string&,unsigned_long)::spchar_abi_cxx11_
                             ._M_string_length);
  if (sVar11 != 0) {
    if (sVar11 == 0xffffffffffffffff) {
      unit_string->_M_string_length = 0;
      *(unit_string->_M_dataplus)._M_p = '\0';
      return true;
    }
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::erase
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)unit_string,0,
               sVar11);
    sVar11 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             find_first_not_of((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               unit_string,
                               cleanUnitString(std::__cxx11::string&,unsigned_long)::
                               spchar_abi_cxx11_._M_dataplus._M_p,0,
                               cleanUnitString(std::__cxx11::string&,unsigned_long)::
                               spchar_abi_cxx11_._M_string_length);
    bVar7 = true;
  }
  local_5a9 = (unit_string->_M_dataplus)._M_p[sVar11] == '/';
  if (local_5a9) {
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::insert
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)unit_string,
               sVar11,1,'1');
    bVar7 = true;
  }
  if ((match_flags >> 0x24 & 1) == 0) {
    pcVar21 = (unit_string->_M_dataplus)._M_p;
    uVar25 = unit_string->_M_string_length;
    pcVar29 = pcVar21 + uVar25;
    pcVar27 = pcVar21;
    if (0 < (long)uVar25 >> 2) {
      pcVar27 = pcVar21 + (uVar25 & 0xfffffffffffffffc);
      lVar30 = ((long)uVar25 >> 2) + 1;
      pcVar21 = pcVar21 + 3;
      do {
        if (pcVar21[-3] < '\0') {
          pcVar21 = pcVar21 + -3;
          goto LAB_0040d685;
        }
        if (pcVar21[-2] < '\0') {
          pcVar21 = pcVar21 + -2;
          goto LAB_0040d685;
        }
        if (pcVar21[-1] < '\0') {
          pcVar21 = pcVar21 + -1;
          goto LAB_0040d685;
        }
        if (*pcVar21 < '\0') goto LAB_0040d685;
        lVar30 = lVar30 + -1;
        pcVar21 = pcVar21 + 4;
      } while (1 < lVar30);
    }
    lVar30 = (long)pcVar29 - (long)pcVar27;
    if (lVar30 == 1) {
LAB_0040d64a:
      pcVar21 = pcVar27;
      if (-1 < *pcVar27) {
        pcVar21 = pcVar29;
      }
    }
    else if (lVar30 == 2) {
LAB_0040d642:
      pcVar21 = pcVar27;
      if (-1 < *pcVar27) {
        pcVar27 = pcVar27 + 1;
        goto LAB_0040d64a;
      }
    }
    else {
      pcVar21 = pcVar29;
      if ((lVar30 == 3) && (pcVar21 = pcVar27, -1 < *pcVar27)) {
        pcVar27 = pcVar27 + 1;
        goto LAB_0040d642;
      }
    }
LAB_0040d685:
    bVar33 = bVar7;
    if (pcVar21 != pcVar29) {
      bVar40 = false;
      lVar30 = 0;
      do {
        pcVar29 = *(char **)((long)&unicodeReplacement(std::__cxx11::string&)::ucodeReplacements +
                            lVar30);
        sVar12 = strlen(pcVar29);
        for (sVar13 = std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                                (unit_string,pcVar29,0,sVar12); sVar13 != 0xffffffffffffffff;
            sVar13 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                     ::find(unit_string,pcVar29,sVar13,sVar12)) {
          sVar12 = strlen(pcVar29);
          if ((sVar13 == 0 || sVar12 != 1) ||
             ((byte)(unit_string->_M_dataplus)._M_p[sVar13 - 1] < 0xc1)) {
            pcVar21 = *(char **)((long)&DAT_00579fe0 + lVar30);
            sVar14 = strlen(pcVar21);
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::replace
                      (unit_string,sVar13,sVar12,pcVar21,sVar14);
            if (sVar13 == 0) {
              sVar13 = 0;
            }
            else if ((unit_string->_M_dataplus)._M_p[sVar13 - 1] == '\\') {
              sVar13 = sVar13 - 1;
              CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              erase((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)unit_string
                    ,sVar13,1);
            }
            sVar12 = strlen(pcVar21);
            sVar13 = sVar12 + sVar13;
            bVar40 = true;
          }
          else {
            sVar13 = sVar13 + 1;
          }
          sVar12 = strlen(pcVar29);
        }
        lVar30 = lVar30 + 0x10;
      } while (lVar30 != 0x420);
      bVar33 = true;
      if (!bVar40) {
        bVar33 = bVar7;
      }
    }
    lVar30 = 0;
    do {
      pcVar29 = *(char **)((long)&cleanUnitString::earlyCodeReplacements._M_elems[0].first + lVar30)
      ;
      sVar12 = strlen(pcVar29);
      sVar13 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                         (unit_string,pcVar29,0,sVar12);
      if (sVar13 != 0xffffffffffffffff) {
        pcVar21 = *(char **)((long)&cleanUnitString::earlyCodeReplacements._M_elems[0].second +
                            lVar30);
        do {
          sVar12 = strlen(pcVar29);
          sVar14 = strlen(pcVar21);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::replace
                    (unit_string,sVar13,sVar12,pcVar21,sVar14);
          sVar12 = strlen(pcVar29);
          sVar13 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                   find(unit_string,pcVar29,sVar13 + 1,sVar12);
        } while (sVar13 != 0xffffffffffffffff);
        bVar33 = true;
      }
      lVar30 = lVar30 + 0x10;
    } while (lVar30 != 0x40);
    sVar13 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             find_first_of(unit_string,
                           cleanUnitString(std::__cxx11::string&,unsigned_long)::spchar_abi_cxx11_.
                           _M_dataplus._M_p,0,
                           cleanUnitString(std::__cxx11::string&,unsigned_long)::spchar_abi_cxx11_.
                           _M_string_length);
    if (sVar13 != 0xffffffffffffffff) {
      local_580 = (char *)0x0;
      iVar9 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              compare((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      unit_string,0,4,"per ");
      if (iVar9 == 0) {
        local_580 = (char *)0x2;
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::replace
                  (unit_string,0,4,"1/",2);
      }
      local_5a9 = iVar9 == 0 || local_5a9;
      bVar7 = ReplaceStringInPlace(unit_string," per ",5,"/",(int)&local_580,in_R9);
      pcVar29 = local_580;
      if (local_580 != (char *)0x0) {
        pcVar21 = (char *)unit_string->_M_string_length;
        uVar25 = 0xffffffffffffffff;
        if (local_580 <= pcVar21 && (long)pcVar21 - (long)local_580 != 0) {
          pcVar22 = (unit_string->_M_dataplus)._M_p;
          pvVar15 = memchr(local_580 + (long)pcVar22,0x28,(long)pcVar21 - (long)local_580);
          uVar25 = -(ulong)(pvVar15 == (void *)0x0) | (long)pvVar15 - (long)pcVar22;
        }
        if (uVar25 != 0xffffffffffffffff) {
          uVar35 = 0xffffffffffffffff;
          if (pcVar29 <= pcVar21 && (long)pcVar21 - (long)pcVar29 != 0) {
            pcVar22 = (unit_string->_M_dataplus)._M_p;
            pvVar15 = memchr(pcVar29 + (long)pcVar22,0x2f,(long)pcVar21 - (long)pcVar29);
            uVar35 = -(ulong)(pvVar15 == (void *)0x0) | (long)pvVar15 - (long)pcVar22;
          }
          do {
            uVar36 = uVar35 + 1;
            __pos = 0xffffffffffffffff;
            sVar12 = unit_string->_M_string_length - uVar36;
            if (uVar36 <= unit_string->_M_string_length && sVar12 != 0) {
              pcVar22 = (unit_string->_M_dataplus)._M_p;
              pvVar15 = memchr(pcVar22 + uVar36,0x2f,sVar12);
              __pos = -(ulong)(pvVar15 == (void *)0x0) | (long)pvVar15 - (long)pcVar22;
            }
            uVar35 = __pos;
            if (uVar25 < __pos) {
              if (__pos == 0xffffffffffffffff) {
                std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                push_back(unit_string,')');
              }
              else {
                CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                ::insert((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         unit_string,__pos,1,')');
              }
              CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              insert((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     unit_string,uVar36,1,'(');
              uVar35 = __pos + 2;
            }
          } while (__pos != 0xffffffffffffffff);
        }
      }
      if (unit_string->_M_string_length == 0) {
        sVar13 = 0;
      }
      else {
        sVar13 = 0;
        do {
          cVar20 = (unit_string->_M_dataplus)._M_p[sVar13];
          if ((cVar20 != ' ') && (cVar20 != '\t')) goto LAB_0040da30;
          sVar13 = sVar13 + 1;
        } while (unit_string->_M_string_length != sVar13);
        sVar13 = 0xffffffffffffffff;
LAB_0040da30:
        sVar13 = sVar13 + 1;
      }
      sVar13 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               find_first_of(unit_string," \t",sVar13,2);
      sVar16 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               find_first_of(unit_string,"*/",0,2);
      pcVar22 = extraout_RDX;
      if (sVar13 == 2) {
        sVar13 = 2;
        if (4 < unit_string->_M_string_length) {
          pcVar22 = (unit_string->_M_dataplus)._M_p;
          uVar25 = 2;
          do {
            if ((pcVar22[uVar25] != ' ') && (pcVar22[uVar25] != '\t')) goto LAB_0040dabb;
            uVar25 = uVar25 + 1;
          } while (unit_string->_M_string_length != uVar25);
          uVar25 = 0xffffffffffffffff;
LAB_0040dabb:
          sVar13 = 2;
          if (((uVar25 != 0xffffffffffffffff) && (sVar16 == 0xffffffffffffffff)) &&
             ((unit_string->_M_dataplus)._M_p[uVar25] != '(')) {
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                      (&local_570[0].first,unit_string,0,2);
            iVar9 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::compare(&local_570[0].first,"fl");
            pcVar22 = extraout_RDX_00;
            if ((iVar9 != 0) &&
               (pVar44 = get_unit(&local_570[0].first,match_flags), pcVar22 = extraout_RDX_01,
               pVar44.base_units_ != (unit_data)0xfa94a488 || !NAN(pVar44.multiplier_))) {
              (unit_string->_M_dataplus)._M_p[2] = '_';
              pVar44 = get_unit(unit_string,match_flags);
              if (pVar44.base_units_ == (unit_data)0xfa94a488 && NAN(pVar44.multiplier_)) {
                (unit_string->_M_dataplus)._M_p[2] = '*';
              }
              sVar13 = std::__cxx11::
                       basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                       find_first_of(unit_string," \t",3,2);
              pcVar22 = extraout_RDX_02;
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_570[0].first._M_dataplus._M_p != &local_570[0].first.field_2) {
              operator_delete(local_570[0].first._M_dataplus._M_p,
                              local_570[0].first.field_2._M_allocated_capacity + 1);
              pcVar22 = extraout_RDX_03;
            }
          }
        }
      }
      if (sVar13 != 0xffffffffffffffff) {
        paVar3 = &local_570[0].first.field_2;
        do {
          cVar20 = (char)pcVar22;
          if (sVar13 + 2 == unit_string->_M_string_length) {
            if (sVar16 == 0xffffffffffffffff) {
              std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              substr(&local_570[0].first,unit_string,0,sVar13);
              pVar44 = get_unit(&local_570[0].first,match_flags);
              bVar40 = pVar44.base_units_ != (unit_data)0xfa94a488;
              if (bVar40 || !NAN(pVar44.multiplier_)) {
                (unit_string->_M_dataplus)._M_p[sVar13] = '_';
                pVar45 = get_unit(unit_string,match_flags);
                if (pVar45.base_units_ == (unit_data)0xfa94a488 && NAN(pVar45.multiplier_)) {
                  (unit_string->_M_dataplus)._M_p[sVar13] = '*';
                }
              }
              cVar20 = -0x78;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_570[0].first._M_dataplus._M_p != paVar3) {
                operator_delete(local_570[0].first._M_dataplus._M_p,
                                local_570[0].first.field_2._M_allocated_capacity + 1);
                cVar20 = extraout_DL;
              }
              if (bVar40 || !NAN(pVar44.multiplier_)) break;
            }
            shortStringReplacement_abi_cxx11_
                      (&local_570[0].first,
                       (units *)(ulong)(uint)(int)(unit_string->_M_dataplus)._M_p[sVar13 + 1],cVar20
                      );
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::replace
                      (unit_string,sVar13 + 1,1,local_570[0].first._M_dataplus._M_p,
                       local_570[0].first._M_string_length);
LAB_0040dce8:
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_570[0].first._M_dataplus._M_p != paVar3) {
              operator_delete(local_570[0].first._M_dataplus._M_p,
                              local_570[0].first.field_2._M_allocated_capacity + 1);
            }
          }
          else {
            pcVar22 = (unit_string->_M_dataplus)._M_p;
            uVar8 = (byte)pcVar22[sVar13 + 1] - 0x20;
            if ((uVar8 < 0x3f) && ((0x400000000000c401U >> ((ulong)uVar8 & 0x3f) & 1) != 0)) {
              shortStringReplacement_abi_cxx11_
                        (&local_570[0].first,(units *)(ulong)(uint)(int)pcVar22[sVar13 + 1],'\x01');
              std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              replace(unit_string,sVar13 + 1,1,local_570[0].first._M_dataplus._M_p,
                      local_570[0].first._M_string_length);
              goto LAB_0040dce8;
            }
          }
          sVar13 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                   find_first_of(unit_string," \t",sVar13 + 1,2);
          pcVar22 = extraout_RDX_04;
        } while (sVar13 != 0xffffffffffffffff);
      }
      local_5a9 = local_5a9 || bVar7;
      sVar13 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                         (unit_string," of ",0,4);
      local_590 = 0xffffffffffffffff;
      do {
        if (sVar13 == 0xffffffffffffffff) break;
        sVar11 = CLI::std::__cxx11::
                 basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 find_first_not_of((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)unit_string,
                                   cleanUnitString(std::__cxx11::string&,unsigned_long)::
                                   spchar_abi_cxx11_._M_dataplus._M_p,sVar13 + 4,
                                   cleanUnitString(std::__cxx11::string&,unsigned_long)::
                                   spchar_abi_cxx11_._M_string_length);
        if (sVar11 == 0xffffffffffffffff) {
LAB_0040dd95:
          sVar13 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                   find(unit_string," of ",sVar13 + 3,4);
          bVar7 = true;
          sVar16 = local_590;
        }
        else {
          cVar20 = (unit_string->_M_dataplus)._M_p[sVar11];
          bVar7 = false;
          sVar16 = sVar13;
          if ((cVar20 != '(') && (cVar20 != '[')) goto LAB_0040dd95;
        }
        local_590 = sVar16;
      } while (bVar7);
      if ((cleanSpaces(std::__cxx11::string&,bool)::spaceChars_abi_cxx11_ == '\0') &&
         (iVar9 = __cxa_guard_acquire(&cleanSpaces(std::__cxx11::string&,bool)::
                                       spaceChars_abi_cxx11_), iVar9 != 0)) {
        paVar3 = &local_570[0].first.field_2;
        local_570[0].first._M_string_length = 4;
        local_570[0].first.field_2._0_5_ = 0xd0a0920;
        local_570[0].first._M_dataplus._M_p = (pointer)paVar3;
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &cleanSpaces(std::__cxx11::string&,bool)::spaceChars_abi_cxx11_,
                       &local_570[0].first,'\0');
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_570[0].first._M_dataplus._M_p != paVar3) {
          operator_delete(local_570[0].first._M_dataplus._M_p,
                          local_570[0].first.field_2._M_allocated_capacity + 1);
        }
        __cxa_atexit(std::__cxx11::string::~string,
                     &cleanSpaces(std::__cxx11::string&,bool)::spaceChars_abi_cxx11_,&__dso_handle);
        __cxa_guard_release(&cleanSpaces(std::__cxx11::string&,bool)::spaceChars_abi_cxx11_);
      }
      paVar3 = &local_570[0].first.field_2;
      local_570[0].first._M_string_length = 7;
      local_570[0].first.field_2._M_allocated_capacity = 0x20657261757173;
      local_570[0].first._M_dataplus._M_p = (pointer)paVar3;
      bVar7 = isolatePriorModifier(unit_string,&local_570[0].first,'d','D');
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_570[0].first._M_dataplus._M_p != paVar3) {
        operator_delete(local_570[0].first._M_dataplus._M_p,
                        local_570[0].first.field_2._M_allocated_capacity + 1);
      }
      local_570[0].first._M_string_length = 6;
      local_570[0].first.field_2._0_7_ = 0x206369627563;
      local_570[0].first._M_dataplus._M_p = (pointer)paVar3;
      bVar40 = isolatePriorModifier(unit_string,&local_570[0].first,'_','-');
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_570[0].first._M_dataplus._M_p != paVar3) {
        operator_delete(local_570[0].first._M_dataplus._M_p,
                        local_570[0].first.field_2._M_allocated_capacity + 1);
      }
      local_570[0].first.field_2._M_allocated_capacity = 0x6465726175717320;
      local_570[0].first._M_string_length = 8;
      local_570[0].first.field_2._M_local_buf[8] = '\0';
      bVar39 = false;
      local_570[0].first._M_dataplus._M_p = (pointer)paVar3;
      sVar13 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                         (unit_string,paVar3->_M_local_buf,0,8);
      if (sVar13 != 0xffffffffffffffff) {
        sVar16 = 0xffffffffffffffff;
        if (unit_string->_M_string_length != 0) {
          uVar25 = unit_string->_M_string_length - 1;
          if (sVar13 - 1 <= uVar25) {
            uVar25 = sVar13 - 1;
          }
          do {
            sVar16 = uVar25;
            if ((unit_string->_M_dataplus)._M_p[uVar25] != ' ') break;
            bVar39 = uVar25 != 0;
            uVar25 = uVar25 - 1;
            sVar16 = 0xffffffffffffffff;
          } while (bVar39);
        }
        sVar16 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 find_last_of(unit_string," */",sVar16,3);
        uVar25 = unit_string->_M_string_length;
        bVar41 = true;
        if (sVar16 < uVar25 && sVar16 != 0) {
          bVar41 = (unit_string->_M_dataplus)._M_p[sVar16] != ' ';
        }
        if (!bVar41) {
          pcVar22 = (unit_string->_M_dataplus)._M_p;
          cVar20 = pcVar22[sVar16 + 1];
          bVar42 = true;
          bVar39 = true;
          if ((cVar20 != '*') && (cVar20 != '/')) {
            cVar4 = pcVar22[sVar16 - 1];
            in_R9 = (size_t *)CONCAT71((int7)((ulong)in_R9 >> 8),cVar4 == '*');
            bVar39 = cVar4 == '/' || cVar4 == '*';
          }
          bVar31 = (cVar20 == '*' || cVar20 == '/') | bVar39;
          bVar31 = cVar20 == ')' | bVar31 | bVar31;
          bVar39 = (bool)(cVar20 == '-' | bVar31 | bVar31);
          if (!bVar39) {
            bVar42 = pcVar22[sVar16 - 1] == ')';
          }
          bVar42 = (bool)(bVar42 | bVar39);
          bVar41 = true;
          if (!bVar42) {
            bVar41 = pcVar22[sVar16 - 1] == '-';
          }
          bVar41 = (bool)(bVar41 | bVar42);
        }
        if (bVar41) {
          bVar39 = false;
        }
        else {
          if (uVar25 == 0) {
LAB_0040e011:
            uVar25 = 0xffffffffffffffff;
          }
          else {
            uVar35 = sVar13 + 1;
            if (uVar25 - 1 <= sVar13) {
              uVar35 = uVar25;
            }
            do {
              uVar25 = uVar35 - 1;
              if (uVar35 == 0) goto LAB_0040e011;
              lVar30 = uVar35 - 1;
              uVar35 = uVar25;
            } while ((unit_string->_M_dataplus)._M_p[lVar30] != '/');
          }
          bVar39 = uVar25 < sVar13;
          if (bVar39) {
            CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            insert((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)unit_string,
                   uVar25 + 1,1,'(');
            uVar25 = sVar13 + 1;
            uVar35 = 0xffffffffffffffff;
            sVar12 = unit_string->_M_string_length - uVar25;
            if (uVar25 <= unit_string->_M_string_length && sVar12 != 0) {
              pcVar22 = (unit_string->_M_dataplus)._M_p;
              pvVar15 = memchr(pcVar22 + uVar25,0x2f,sVar12);
              uVar35 = -(ulong)(pvVar15 == (void *)0x0) | (long)pvVar15 - (long)pcVar22;
            }
            if (uVar35 == 0xffffffffffffffff) {
              std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              push_back(unit_string,')');
            }
            else {
              CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              insert((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     unit_string,uVar35,1,')');
            }
            sVar16 = sVar16 + 1;
            bVar41 = uVar35 < sVar16;
            bVar39 = true;
          }
        }
        if (!bVar41) {
          (unit_string->_M_dataplus)._M_p[sVar16] = '*';
          bVar39 = true;
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_570[0].first._M_dataplus._M_p != paVar3) {
        operator_delete(local_570[0].first._M_dataplus._M_p,
                        local_570[0].first.field_2._M_allocated_capacity + 1);
      }
      bVar31 = (bVar7 || bVar40) | bVar39;
      sVar13 = 0;
      do {
        sVar13 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 find_first_of(unit_string,
                               cleanSpaces(std::__cxx11::string&,bool)::spaceChars_abi_cxx11_,sVar13
                               ,DAT_00587b78);
        do {
          bVar32 = bVar31;
          if (sVar13 == 0xffffffffffffffff) goto LAB_0040e608;
          if ((sVar13 == 0) || (local_5a9)) goto LAB_0040e5c0;
          sVar11 = CLI::std::__cxx11::
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                   find_first_not_of((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)unit_string,
                                     cleanSpaces(std::__cxx11::string&,bool)::spaceChars_abi_cxx11_,
                                     sVar13,DAT_00587b78);
          if (sVar11 == 0xffffffffffffffff) {
            if (unit_string->_M_string_length < sVar13) {
              std::__throw_out_of_range_fmt
                        ("%s: __pos (which is %zu) > this->size() (which is %zu)",
                         "basic_string::erase",sVar13);
            }
            unit_string->_M_string_length = sVar13;
            (unit_string->_M_dataplus)._M_p[sVar13] = '\0';
            iVar9 = 1;
            goto LAB_0040e300;
          }
          if (sVar13 == 1) {
            pcVar22 = (unit_string->_M_dataplus)._M_p;
            if (((byte)pcVar22[sVar11] - 0x2a < 0x35) &&
               ((0x10000000400021U >> ((ulong)((byte)pcVar22[sVar11] - 0x2a) & 0x3f) & 1) != 0)) {
              CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              erase((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)unit_string
                    ,1,1);
              sVar13 = 1;
              goto LAB_0040e2f2;
            }
            if (7 < unit_string->_M_string_length) {
              pvVar15 = memchr(pcVar22,0x2a,unit_string->_M_string_length);
              sVar13 = 1;
              if (pvVar15 == (void *)0x0 || (long)pvVar15 - (long)pcVar22 == -1) {
                sVar13 = std::__cxx11::
                         basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                         find_first_of(unit_string,"/^",sVar11,2);
                if (sVar13 < 9) {
                  (unit_string->_M_dataplus)._M_p[1] = '*';
                  sVar13 = std::__cxx11::
                           basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                           find_first_of(unit_string,
                                         cleanSpaces(std::__cxx11::string&,bool)::
                                         spaceChars_abi_cxx11_,1,DAT_00587b78);
                  local_5a9 = true;
                  iVar9 = 2;
                  goto LAB_0040e300;
                }
                sVar13 = 1;
              }
              goto LAB_0040e295;
            }
            pcVar22[1] = '*';
            sVar13 = 1;
LAB_0040e5a9:
            sVar13 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                     ::find_first_of(unit_string,
                                     cleanSpaces(std::__cxx11::string&,bool)::spaceChars_abi_cxx11_,
                                     sVar13,DAT_00587b78);
            local_5a9 = true;
LAB_0040e2fa:
            iVar9 = 2;
          }
          else {
LAB_0040e295:
            pbVar2 = (byte *)(unit_string->_M_dataplus)._M_p;
            bVar31 = pbVar2[sVar13 - 1];
            if (bVar31 == 0x2f) {
LAB_0040e2b1:
              CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              erase((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)unit_string
                    ,sVar13,1);
LAB_0040e2f2:
              sVar13 = std::__cxx11::
                       basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                       find_first_of(unit_string,
                                     cleanSpaces(std::__cxx11::string&,bool)::spaceChars_abi_cxx11_,
                                     sVar13,DAT_00587b78);
              goto LAB_0040e2fa;
            }
            if (bVar31 == 0x2e) {
              sVar13 = sVar13 + 1;
              goto LAB_0040e2f2;
            }
            if ((bVar31 == 0x2a) ||
               ((sVar11 < unit_string->_M_string_length &&
                ((pbVar2[sVar11] == 0x2f || (pbVar2[sVar11] == 0x2a)))))) goto LAB_0040e2b1;
            pbVar1 = pbVar2 + sVar13;
            pbVar23 = pbVar2;
            if (0 < (long)sVar13 >> 2) {
              pbVar23 = pbVar2 + (sVar13 & 0xfffffffffffffffc);
              lVar30 = ((long)sVar13 >> 2) + 1;
              pbVar28 = pbVar2 + 3;
              do {
                bVar31 = pbVar28[-3];
                in_R9 = (size_t *)(ulong)(bVar31 - 0x30);
                if ((9 < (byte)(bVar31 - 0x30)) &&
                   ((0x2f < bVar31 || ((0xec0000000000U >> ((ulong)(uint)bVar31 & 0x3f) & 1) == 0)))
                   ) {
                  pbVar28 = pbVar28 + -3;
                  goto LAB_0040e49f;
                }
                bVar31 = pbVar28[-2];
                in_R9 = (size_t *)(ulong)(bVar31 - 0x30);
                if ((9 < (byte)(bVar31 - 0x30)) &&
                   ((0x2f < bVar31 || ((0xec0000000000U >> ((ulong)(uint)bVar31 & 0x3f) & 1) == 0)))
                   ) {
                  pbVar28 = pbVar28 + -2;
                  goto LAB_0040e49f;
                }
                bVar31 = pbVar28[-1];
                in_R9 = (size_t *)(ulong)(bVar31 - 0x30);
                if ((9 < (byte)(bVar31 - 0x30)) &&
                   ((0x2f < bVar31 || ((0xec0000000000U >> ((ulong)(uint)bVar31 & 0x3f) & 1) == 0)))
                   ) {
                  pbVar28 = pbVar28 + -1;
                  goto LAB_0040e49f;
                }
                bVar31 = *pbVar28;
                in_R9 = (size_t *)(ulong)(bVar31 - 0x30);
                if ((9 < (byte)(bVar31 - 0x30)) &&
                   ((0x2f < bVar31 || ((0xec0000000000U >> ((ulong)(uint)bVar31 & 0x3f) & 1) == 0)))
                   ) goto LAB_0040e49f;
                lVar30 = lVar30 + -1;
                pbVar28 = pbVar28 + 4;
              } while (1 < lVar30);
            }
            lVar30 = (long)pbVar1 - (long)pbVar23;
            if (lVar30 == 1) {
LAB_0040e453:
              bVar31 = *pbVar23;
              pbVar28 = pbVar1;
              if ((9 < (byte)(bVar31 - 0x30)) &&
                 ((0x2e < bVar31 || ((0x680000000000U >> ((ulong)(uint)bVar31 & 0x3f) & 1) == 0))))
              {
                if (bVar31 == 0x2f) {
                  pbVar23 = pbVar1;
                }
                pbVar28 = pbVar23;
                if (bVar31 == 0x2a) {
                  pbVar28 = pbVar1;
                }
              }
            }
            else if (lVar30 == 2) {
LAB_0040e437:
              bVar31 = *pbVar23;
              if (((byte)(bVar31 - 0x30) < 10) ||
                 ((pbVar28 = pbVar23, bVar31 < 0x30 &&
                  ((0xec0000000000U >> ((ulong)(uint)bVar31 & 0x3f) & 1) != 0)))) {
                pbVar23 = pbVar23 + 1;
                goto LAB_0040e453;
              }
            }
            else {
              pbVar28 = pbVar1;
              if ((lVar30 == 3) &&
                 ((bVar31 = *pbVar23, (byte)(bVar31 - 0x30) < 10 ||
                  ((pbVar28 = pbVar23, bVar31 < 0x30 &&
                   ((0xec0000000000U >> ((ulong)(uint)bVar31 & 0x3f) & 1) != 0)))))) {
                pbVar23 = pbVar23 + 1;
                goto LAB_0040e437;
              }
            }
LAB_0040e49f:
            if (pbVar28 == pbVar1) {
              *pbVar1 = 0x2a;
              goto LAB_0040e5a9;
            }
            iVar9 = 0;
            iVar38 = 0;
            if (sVar13 != 0) {
              uVar25 = 0;
              lVar30 = 0;
              do {
                lVar30 = lVar30 + (ulong)(pbVar2[uVar25] == 0x2f);
                uVar25 = uVar25 + 1;
              } while (sVar13 != uVar25);
              if (((lVar30 == 1) &&
                  (sVar16 = std::__cxx11::
                            basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::rfind
                                      (unit_string,"/sq",sVar13,3), sVar16 == 0xffffffffffffffff))
                 && (sVar16 = std::__cxx11::
                              basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                              rfind(unit_string,"/cu",sVar13,3), iVar9 = iVar38,
                    sVar16 == 0xffffffffffffffff)) {
                sVar11 = CLI::std::__cxx11::
                         basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                         find_first_not_of((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            *)unit_string,
                                           cleanSpaces(std::__cxx11::string&,bool)::
                                           spaceChars_abi_cxx11_,sVar13,DAT_00587b78);
                sVar16 = std::__cxx11::
                         basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                         find_first_of(unit_string,anon_var_dwarf_2a12c4f,sVar13,9);
                if (((sVar11 != 0xffffffffffffffff) && (sVar16 != sVar11)) &&
                   (pcVar22 = (unit_string->_M_dataplus)._M_p,
                   9 < (byte)(pcVar22[sVar13 - 1] - 0x30U))) {
                  pcVar22[sVar13] = '*';
                  goto LAB_0040e5a9;
                }
              }
            }
          }
LAB_0040e300:
          bVar32 = 1;
          bVar31 = 1;
        } while (iVar9 == 2);
        if (iVar9 != 0) goto LAB_0040e608;
LAB_0040e5c0:
        bVar7 = local_5a9;
        if ((sVar13 == 0) || (bVar7 = true, (unit_string->_M_dataplus)._M_p[sVar13 - 1] != '.')) {
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          erase((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)unit_string,
                sVar13,1);
          bVar31 = 1;
          local_5a9 = bVar7;
        }
        else {
          sVar13 = sVar13 + 1;
          bVar31 = 1;
        }
      } while( true );
    }
    local_590 = 0xffffffffffffffff;
    bVar7 = bVar33;
    goto LAB_0040e624;
  }
  local_590 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                        (unit_string,"of(",0,3);
  goto LAB_0040e894;
LAB_0040ee27:
  bVar7 = cVar20 == '\x01';
  goto LAB_0040ee2d;
LAB_0040ef97:
  if (1 < iVar9) {
    if (unit_string->_M_string_length == 0) {
      uVar25 = 0xffffffffffffffff;
    }
    else {
      pcVar22 = (unit_string->_M_dataplus)._M_p;
      pvVar15 = memchr(pcVar22,0x2e,unit_string->_M_string_length);
      uVar25 = -(ulong)(pvVar15 == (void *)0x0) | (long)pvVar15 - (long)pcVar22;
    }
    iVar9 = 0;
    while (uVar25 != 0xffffffffffffffff) {
      pcVar22 = (unit_string->_M_dataplus)._M_p;
      uVar35 = uVar25;
      do {
        uVar36 = uVar35;
        cVar20 = pcVar22[uVar36 + 1];
        if (cVar20 == '.') goto LAB_0040f04a;
        uVar35 = uVar36 + 1;
      } while ((byte)(cVar20 - 0x30U) < 10);
      uVar25 = 0xffffffffffffffff;
      if (uVar36 + 2 < unit_string->_M_string_length) {
        pvVar15 = memchr(pcVar22 + uVar36 + 2,0x2e,~(uVar36 + 1) + unit_string->_M_string_length);
        uVar25 = -(ulong)(pvVar15 == (void *)0x0) | (long)pvVar15 - (long)pcVar22;
      }
LAB_0040f04a:
      if (cVar20 == '.') {
        pcVar22[uVar36 + 1] = '*';
        uVar25 = 0xffffffffffffffff;
        if (uVar36 + 2 < unit_string->_M_string_length) {
          pcVar22 = (unit_string->_M_dataplus)._M_p;
          pvVar15 = memchr(pcVar22 + uVar36 + 2,0x2e,(unit_string->_M_string_length - uVar36) - 2);
          uVar25 = -(ulong)(pvVar15 == (void *)0x0) | (long)pvVar15 - (long)pcVar22;
        }
      }
      else {
        iVar9 = iVar9 + 1;
      }
    }
  }
  if (0 < iVar9) {
    uVar25 = 0xffffffffffffffff;
    if (2 < unit_string->_M_string_length) {
      pcVar22 = (unit_string->_M_dataplus)._M_p;
      pvVar15 = memchr(pcVar22 + 2,0x2e,unit_string->_M_string_length - 2);
      uVar25 = -(ulong)(pvVar15 == (void *)0x0) | (long)pvVar15 - (long)pcVar22;
    }
    while (uVar25 != 0xffffffffffffffff) {
      pcVar22 = (unit_string->_M_dataplus)._M_p;
      uVar35 = uVar25;
      do {
        uVar35 = uVar35 - 1;
        if (uVar35 == 0) goto LAB_0040f123;
        bVar31 = pcVar22[uVar35];
      } while ((byte)(bVar31 - 0x30) < 10);
      if ((bVar31 | 0x20) == 0x65) {
        pcVar22[uVar25] = '*';
      }
LAB_0040f123:
      uVar35 = uVar25 + 1;
      uVar25 = 0xffffffffffffffff;
      sVar12 = unit_string->_M_string_length - uVar35;
      if (uVar35 <= unit_string->_M_string_length && sVar12 != 0) {
        pcVar22 = (unit_string->_M_dataplus)._M_p;
        pvVar15 = memchr(pcVar22 + uVar35,0x2e,sVar12);
        uVar25 = -(ulong)(pvVar15 == (void *)0x0) | (long)pvVar15 - (long)pcVar22;
      }
    }
  }
  if ((local_598 >> 10 & 1) == 0) {
    bVar33 = true;
  }
  else {
    if (unit_string->_M_string_length == 0) {
LAB_0040f193:
      sVar16 = 0xffffffffffffffff;
    }
    else {
      sVar13 = unit_string->_M_string_length;
      do {
        sVar16 = sVar13 - 1;
        if (sVar13 == 0) goto LAB_0040f193;
        lVar30 = sVar13 - 1;
        sVar13 = sVar16;
      } while ((unit_string->_M_dataplus)._M_p[lVar30] != '/');
    }
    bVar33 = true;
    if (sVar16 != 0xffffffffffffffff) {
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::insert
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)unit_string,
                 sVar16 + 1,1,'(');
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                (unit_string,')');
    }
  }
  goto LAB_0040f1c4;
LAB_0040e608:
  if (unit_string->_M_string_length == 0) {
    return true;
  }
  bVar7 = (bool)(bVar33 | bVar32);
LAB_0040e624:
  sVar13 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                     (unit_string,"10*",0,3);
  while (sVar13 != 0xffffffffffffffff) {
    uVar25 = sVar13 + 3;
    if (uVar25 < unit_string->_M_string_length) {
      pcVar22 = (unit_string->_M_dataplus)._M_p;
      bVar31 = pcVar22[uVar25];
      if ((((byte)(bVar31 - 0x30) < 10) ||
          ((bVar31 < 0x2f && ((0x680000000000U >> ((ulong)(uint)bVar31 & 0x3f) & 1) != 0)))) &&
         (((sVar13 == 0 ||
           ((bVar31 = pcVar22[sVar13 - 1], 9 < (byte)(bVar31 - 0x30) &&
            ((0x3a < bVar31 - 0x2b ||
             ((0x40000000400000dU >> ((ulong)(bVar31 - 0x2b) & 0x3f) & 1) == 0)))))) ||
          ((sVar13 != 1 && ((bVar31 == 0x2e && ((byte)(pcVar22[sVar13 - 2] - 0x3aU) < 0xf6)))))))) {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                  (&local_570[0].first,unit_string,uVar25,0xffffffffffffffff);
        __nptr._M_p = local_570[0].first._M_dataplus._M_p;
        if ((local_570[0].first._M_string_length != 0) &&
           (uVar35 = (ulong)((*local_570[0].first._M_dataplus._M_p - 0x2bU & 0xfd) == 0),
           (byte)(local_570[0].first._M_dataplus._M_p[uVar35] - 0x30U) < 10)) {
          uVar35 = uVar35 + 1;
          do {
            if (local_570[0].first._M_string_length <= uVar35) goto LAB_0040e77b;
            pbVar2 = (byte *)(local_570[0].first._M_dataplus._M_p + uVar35);
            uVar35 = uVar35 + 1;
          } while ((byte)(*pbVar2 - 0x30) < 10);
          uVar8 = *pbVar2 - 0x2e;
          if ((((0x37 < uVar8) || ((0x80000000800001U >> ((ulong)uVar8 & 0x3f) & 1) == 0)) ||
              (local_570[0].first._M_string_length <= uVar35)) ||
             ((9 < (byte)(local_570[0].first._M_dataplus._M_p[uVar35] - 0x30U) &&
              ((local_570[0].first._M_dataplus._M_p[uVar35] - 0x2bU & 0xfd) != 0)))) {
LAB_0040e77b:
            puVar17 = (uint *)__errno_location();
            uVar8 = *puVar17;
            *puVar17 = 0;
            lVar30 = strtol(__nptr._M_p,&local_580,10);
            if (local_580 == __nptr._M_p) {
              uVar18 = std::__throw_invalid_argument("stoi");
LAB_0040fc93:
              if (local_570[0].first._M_dataplus._M_p != (pointer)(ulong)uVar8) {
                operator_delete(local_570[0].first._M_dataplus._M_p,
                                local_570[0].first.field_2._M_allocated_capacity + 1);
              }
              __cxa_guard_abort(&cleanSpaces(std::__cxx11::string&,bool)::spaceChars_abi_cxx11_);
              _Unwind_Resume(uVar18);
            }
            uVar10 = (uint)lVar30;
            if (((int)uVar10 != lVar30) || (*puVar17 == 0x22)) {
              uVar18 = std::__throw_out_of_range("stoi");
              goto LAB_0040fc93;
            }
            if (*puVar17 == 0) {
              *puVar17 = uVar8;
            }
            uVar8 = -uVar10;
            if (0 < (int)uVar10) {
              uVar8 = uVar10;
            }
            if (uVar8 < 0x27) {
              std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              replace(unit_string,sVar13,3,"1e",2);
            }
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_570[0].first._M_dataplus._M_p != &local_570[0].first.field_2) {
          operator_delete(local_570[0].first._M_dataplus._M_p,
                          local_570[0].first.field_2._M_allocated_capacity + 1);
        }
      }
    }
    sVar13 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                       (unit_string,"10*",uVar25,3);
  }
LAB_0040e894:
  if ((*(unit_string->_M_dataplus)._M_p == '(') &&
     (removeOuterParenthesis(unit_string), unit_string->_M_string_length == 0)) {
    return true;
  }
  bVar33 = bVar7;
  if ((match_flags >> 0x24 & 1) == 0) {
    local_570[0].first._M_dataplus._M_p = (pointer)0x0;
    bVar40 = ReplaceStringInPlace(unit_string,"**",2,"^",(int)local_570,in_R9);
    bVar33 = true;
    if (!bVar40) {
      bVar33 = bVar7;
    }
  }
  local_598 = (uint)match_flags;
  if ((local_598 >> 9 & 1) != 0) {
    if ((ciConversion(std::__cxx11::string&)::ciConversions_abi_cxx11_ == '\0') &&
       (iVar9 = __cxa_guard_acquire(&ciConversion(std::__cxx11::string&)::ciConversions_abi_cxx11_),
       iVar9 != 0)) {
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<const_char_(&)[2],_const_char_(&)[2],_true>
                (local_570,(char (*) [2])0x45a6b7,(char (*) [2])0x45cef2);
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<const_char_(&)[2],_const_char_(&)[2],_true>
                (local_570 + 1,(char (*) [2])0x46660d,(char (*) [2])0x46399e);
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<const_char_(&)[2],_const_char_(&)[2],_true>
                (local_570 + 2,(char (*) [2])0x45a86f,(char (*) [2])0x43c0bf);
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<const_char_(&)[3],_const_char_(&)[3],_true>
                (local_570 + 3,(char (*) [3])"MM",(char (*) [3])0x4660d5);
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<const_char_(&)[3],_const_char_(&)[3],_true>
                (&local_470,(char (*) [3])"NM",(char (*) [3])"nm");
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<const_char_(&)[3],_const_char_(&)[3],_true>
                (&local_430,(char (*) [3])0x4449d4,(char (*) [3])0x461f46);
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<const_char_(&)[3],_const_char_(&)[3],_true>
                (&local_3f0,(char (*) [3])"GS",(char (*) [3])"Gs");
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<const_char_(&)[3],_const_char_(&)[4],_true>
                (&local_3b0,(char (*) [3])"GL",(char (*) [4])"Gal");
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<const_char_(&)[3],_const_char_(&)[3],_true>
                (&local_370,(char (*) [3])"MG",(char (*) [3])"mg");
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<const_char_(&)[4],_const_char_(&)[4],_true>
                (&local_330,(char (*) [4])"[G]",(char (*) [4])"[g]");
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<const_char_(&)[3],_const_char_(&)[3],_true>
                (&local_2f0,(char (*) [3])"PG",(char (*) [3])"pg");
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<const_char_(&)[3],_const_char_(&)[3],_true>
                (&local_2b0,(char (*) [3])0x4611c4,(char (*) [3])0x462bc0);
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<const_char_(&)[3],_const_char_(&)[3],_true>
                (&local_270,(char (*) [3])0x4611f8,(char (*) [3])0x45a809);
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<const_char_(&)[3],_const_char_(&)[3],_true>
                (&local_230,(char (*) [3])0x4663f7,(char (*) [3])0x465070);
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<const_char_(&)[3],_const_char_(&)[3],_true>
                (&local_1f0,(char (*) [3])0x46358e,(char (*) [3])0x46365a);
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<const_char_(&)[4],_const_char_(&)[4],_true>
                (&local_1b0,(char (*) [4])"RAD",(char (*) [4])0x46273c);
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<const_char_(&)[3],_const_char_(&)[8],_true>
                (&local_170,(char (*) [3])"GB",(char (*) [8])"gilbert");
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<const_char_(&)[3],_const_char_(&)[3],_true>
                (&local_130,(char (*) [3])"WB",(char (*) [3])"Wb");
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<const_char_(&)[3],_const_char_(&)[3],_true>
                (&local_f0,(char (*) [3])0x4577b9,(char (*) [3])"cP");
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<const_char_(&)[3],_const_char_(&)[3],_true>
                (&local_b0,(char (*) [3])"EV",(char (*) [3])"eV");
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<const_char_(&)[3],_const_char_(&)[3],_true>
                (&local_70,(char (*) [3])"PT",(char (*) [3])"pT");
      std::
      _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
      ::_Hashtable<std::pair<std::__cxx11::string_const,std::__cxx11::string>const*>
                ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                  *)ciConversion(std::__cxx11::string&)::ciConversions_abi_cxx11_,local_570,
                 &stack0xffffffffffffffd0,0,&local_580,&local_581,&local_582);
      lVar30 = 0x500;
      do {
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)((long)&local_570[0].first._M_dataplus._M_p + lVar30));
        lVar30 = lVar30 + -0x40;
      } while (lVar30 != -0x40);
      __cxa_atexit(std::
                   unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::~unordered_map,ciConversion(std::__cxx11::string&)::ciConversions_abi_cxx11_,
                   &__dso_handle);
      __cxa_guard_release(&ciConversion(std::__cxx11::string&)::ciConversions_abi_cxx11_);
    }
    sVar13 = unit_string->_M_string_length;
    if (sVar13 != 0) {
      pcVar22 = (unit_string->_M_dataplus)._M_p;
      sVar16 = 0;
      do {
        iVar9 = toupper((int)pcVar22[sVar16]);
        pcVar22[sVar16] = (char)iVar9;
        sVar16 = sVar16 + 1;
      } while (sVar13 != sVar16);
    }
    cVar19 = std::
             _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
             ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                     *)ciConversion(std::__cxx11::string&)::ciConversions_abi_cxx11_,unit_string);
    if (cVar19.
        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
        ._M_cur == (__node_type *)0x0) {
      pcVar29 = (unit_string->_M_dataplus)._M_p;
      cVar20 = *pcVar29;
      if (cVar20 == 'P') {
        cVar20 = 'p';
LAB_0040e96c:
        *pcVar29 = cVar20;
      }
      else if (cVar20 == 'M') {
        cVar20 = 'm';
        goto LAB_0040e96c;
      }
      pcVar29 = (unit_string->_M_dataplus)._M_p;
      sVar13 = unit_string->_M_string_length;
      if (pcVar29[sVar13 - 1] == 'M') {
        if (sVar13 == 3) {
          dVar43 = getPrefixMultiplier2Char(*pcVar29,pcVar29[1]);
        }
        else {
          if (sVar13 != 2) goto LAB_0040e9c2;
          dVar43 = getPrefixMultiplier(*pcVar29);
        }
        if ((dVar43 != 0.0) || (NAN(dVar43))) {
          pcVar29[sVar13 - 1] = 'm';
        }
      }
    }
    else {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
                (unit_string,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)cVar19.
                        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                        ._M_cur + 0x28));
    }
LAB_0040e9c2:
    sVar13 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                       (unit_string,"/S",0,2);
    if (sVar13 != 0xffffffffffffffff) {
      (unit_string->_M_dataplus)._M_p[sVar13 + 1] = 's';
    }
    sVar13 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                       (unit_string,"/G",0,2);
    bVar33 = true;
    if (sVar13 != 0xffffffffffffffff) {
      (unit_string->_M_dataplus)._M_p[sVar13 + 1] = 'g';
    }
  }
  if ((match_flags >> 0x24 & 1) == 0) {
    if (unit_string->_M_string_length != 0) {
      sVar13 = unit_string->_M_string_length;
      do {
        if (sVar13 == 0) goto LAB_0040ebd9;
        lVar30 = sVar13 - 1;
        sVar13 = sVar13 - 1;
      } while ((unit_string->_M_dataplus)._M_p[lVar30] != '<');
      sVar13 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                         (unit_string,"<sup>",0,5);
      while (sVar13 != 0xffffffffffffffff) {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::replace
                  (unit_string,sVar13,5,"^",1);
        sVar13 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 find(unit_string,"</sup>",0,6);
        if (sVar13 == 0xffffffffffffffff) {
          sVar13 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                   find(unit_string,"<\\/sup>",0,7);
          if (sVar13 != 0xffffffffffffffff) {
            sVar16 = 8;
            goto LAB_0040eaea;
          }
        }
        else {
          sVar16 = 6;
LAB_0040eaea:
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::replace
                    (unit_string,sVar13,sVar16,"",0);
        }
        sVar13 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 find(unit_string,"<sup>",0,5);
      }
      sVar13 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                         (unit_string,"<sub>",0,5);
      while (sVar13 != 0xffffffffffffffff) {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::replace
                  (unit_string,sVar13,5,"_",1);
        sVar13 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 find(unit_string,"</sub>",0,6);
        if (sVar13 == 0xffffffffffffffff) {
          sVar13 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                   find(unit_string,"<\\/sub>",0,7);
          if (sVar13 != 0xffffffffffffffff) {
            sVar16 = 8;
            goto LAB_0040ebb0;
          }
        }
        else {
          sVar16 = 6;
LAB_0040ebb0:
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::replace
                    (unit_string,sVar13,sVar16,"",0);
        }
        sVar13 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 find(unit_string,"<sub>",0,5);
      }
    }
LAB_0040ebd9:
    lVar30 = 0;
    do {
      pcVar29 = *(char **)((long)&cleanUnitString::allCodeReplacements._M_elems[0].first + lVar30);
      sVar12 = strlen(pcVar29);
      sVar13 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                         (unit_string,pcVar29,0,sVar12);
      if (sVar13 != 0xffffffffffffffff) {
        pcVar21 = *(char **)((long)&cleanUnitString::allCodeReplacements._M_elems[0].second + lVar30
                            );
        do {
          sVar12 = strlen(pcVar29);
          sVar14 = strlen(pcVar21);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::replace
                    (unit_string,sVar13,sVar12,pcVar21,sVar14);
          sVar12 = strlen(pcVar29);
          sVar13 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                   find(unit_string,pcVar29,sVar13 + 1,sVar12);
        } while (sVar13 != 0xffffffffffffffff);
        bVar33 = true;
      }
      lVar30 = lVar30 + 0x10;
    } while (lVar30 != 0x210);
  }
  uVar25 = unit_string->_M_string_length;
  if ((1 < uVar25) &&
     (pcVar22 = (unit_string->_M_dataplus)._M_p, (pcVar22[uVar25 - 1] & 0xfeU) == 0x32)) {
    pcVar29 = pcVar22 + (uVar25 - 1);
    if (((pcVar22[uVar25 - 2] == '-') || (pcVar22[uVar25 - 2] == '+')) && (uVar25 != 2)) {
      pcVar29 = pcVar22 + (uVar25 - 2);
    }
    if (9 < (byte)(pcVar29[-1] - 0x30U)) {
      uVar8 = (byte)pcVar29[-1] - 0x2a;
      if (uVar8 < 0x3c) {
        if ((0x81000000800003aU >> ((ulong)uVar8 & 0x3f) & 1) == 0) {
          if ((ulong)uVar8 != 0) goto LAB_0040f835;
          pcVar29[-1] = '^';
        }
      }
      else {
LAB_0040f835:
        if (*pcVar29 == '+') {
          *pcVar29 = '^';
        }
        else {
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          _M_replace_aux(unit_string,(long)pcVar29 - (long)pcVar22,0,1,'^');
        }
      }
    }
  }
  if ((match_flags >> 0x24 & 1) == 0) {
    uVar25 = unit_string->_M_string_length;
    if (uVar25 == 0) {
LAB_0040ed21:
      uVar36 = 0xffffffffffffffff;
    }
    else {
      uVar35 = uVar25;
      do {
        uVar36 = uVar35 - 1;
        if (uVar35 == 0) goto LAB_0040ed21;
        lVar30 = uVar35 - 1;
        uVar35 = uVar36;
      } while ((unit_string->_M_dataplus)._M_p[lVar30] != '.');
    }
    if ((uVar36 != 0xffffffffffffffff) &&
       (pcVar22 = (unit_string->_M_dataplus)._M_p, 9 < (byte)(pcVar22[uVar36 + 1] - 0x30U))) {
      if (uVar25 == 0) {
        uVar35 = 0xffffffffffffffff;
      }
      else {
        pvVar15 = memchr(pcVar22,0x2e,uVar25);
        uVar35 = -(ulong)(pvVar15 == (void *)0x0) | (long)pvVar15 - (long)pcVar22;
      }
      if (uVar35 != 0xffffffffffffffff) {
        cVar20 = '\0';
        do {
          cVar4 = cVar20;
          if (uVar35 == 0) {
            if ((1 < uVar25) && (9 < (byte)(pcVar22[1] - 0x30U))) {
              cVar4 = '\x01';
            }
          }
          else if ((uVar35 == 0xffffffffffffffff) ||
                  (((9 < (byte)(pcVar22[uVar35 - 1] - 0x30U) ||
                    (9 < (byte)(pcVar22[uVar35 + 1] - 0x30U))) &&
                   ((cVar20 = '\x02', pcVar22[uVar35 - 1] == '*' ||
                    ((uVar35 == uVar25 - 1 || (cVar4 = '\x01', pcVar22[uVar35 + 1] == ' '))))))))
          goto LAB_0040ee27;
          cVar20 = cVar4;
          uVar36 = uVar35 + 1;
          uVar35 = 0xffffffffffffffff;
          if (uVar36 <= uVar25 && uVar25 - uVar36 != 0) {
            pvVar15 = memchr(pcVar22 + uVar36,0x2e,uVar25 - uVar36);
            uVar35 = -(ulong)(pvVar15 == (void *)0x0) | (long)pvVar15 - (long)pcVar22;
          }
        } while( true );
      }
      bVar7 = false;
LAB_0040ee2d:
      if (uVar25 == 0) {
        sVar11 = 0xffffffffffffffff;
      }
      else {
        pvVar15 = memchr(pcVar22,0x2e,uVar25);
        sVar11 = -(ulong)(pvVar15 == (void *)0x0) | (long)pvVar15 - (long)pcVar22;
      }
      iVar9 = 0;
LAB_0040ee61:
      if (sVar11 == 0) {
        if (1 < unit_string->_M_string_length) {
          pcVar22 = (unit_string->_M_dataplus)._M_p;
          if ((byte)(pcVar22[1] - 0x30U) < 10) {
            iVar9 = iVar9 + 1;
          }
          else {
            if (!bVar7) {
              while ((cVar20 = *(unit_string->_M_dataplus)._M_p, cVar20 == '.' || (cVar20 == ' ')))
              {
                CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                ::erase((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        unit_string,0,1);
              }
              sVar37 = 0xffffffffffffffff;
              goto LAB_0040eedb;
            }
            *pcVar22 = '*';
          }
        }
        sVar37 = 0;
      }
      else {
        if (sVar11 == 0xffffffffffffffff) goto LAB_0040ef97;
        pcVar22 = (unit_string->_M_dataplus)._M_p;
        sVar37 = sVar11;
        if ((((byte)(pcVar22[sVar11 - 1] - 0x30U) < 10) &&
            ((byte)(pcVar22[sVar11 + 1] - 0x30U) < 10)) || (pcVar22[sVar11 - 1] == '*')) {
          iVar9 = iVar9 + 1;
        }
        else if (bVar7) {
          pcVar22[sVar11] = '*';
        }
        else {
          sVar37 = sVar11 - 1;
          while ((cVar20 = (unit_string->_M_dataplus)._M_p[sVar11], cVar20 == '.' || (cVar20 == ' ')
                 )) {
            CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            erase((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)unit_string,
                  sVar11,1);
          }
        }
      }
LAB_0040eedb:
      uVar25 = sVar37 + 1;
      sVar11 = 0xffffffffffffffff;
      sVar12 = unit_string->_M_string_length - uVar25;
      if (uVar25 <= unit_string->_M_string_length && sVar12 != 0) {
        pcVar22 = (unit_string->_M_dataplus)._M_p;
        pvVar15 = memchr(pcVar22 + uVar25,0x2e,sVar12);
        sVar11 = -(ulong)(pvVar15 == (void *)0x0) | (long)pvVar15 - (long)pcVar22;
      }
      goto LAB_0040ee61;
    }
LAB_0040f1c4:
    for (sVar13 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  find(unit_string,"()",0,2); sVar13 != 0xffffffffffffffff;
        sVar13 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 find(unit_string,"()",sVar13,2)) {
      if ((sVar13 + 2 < unit_string->_M_string_length) &&
         ((unit_string->_M_dataplus)._M_p[sVar13 + 2] == '^')) {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::replace
                  (unit_string,sVar13,2,"*1",2);
      }
      else {
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::erase
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)unit_string,
                   sVar13,2);
      }
    }
    clearEmptySegments(unit_string);
    sVar13 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                       (unit_string,"(1)^",0,4);
    do {
      if (sVar13 == 0xffffffffffffffff) break;
      pcVar22 = (unit_string->_M_dataplus)._M_p;
      cVar20 = pcVar22[sVar13 + 4];
      if ((cVar20 == '-') || (cVar20 == '+')) {
        if (sVar13 + 5 < unit_string->_M_string_length) {
          cVar20 = pcVar22[sVar13 + 5];
          sVar24 = 5;
          goto LAB_0040f2bc;
        }
        multiplyRep(unit_string,sVar13,5);
        bVar7 = false;
      }
      else {
        sVar24 = 4;
LAB_0040f2bc:
        if ((byte)(cVar20 - 0x30U) < 10) {
          do {
            sVar24 = sVar24 + 1;
            if (unit_string->_M_string_length <= sVar24 + sVar13) break;
          } while ((byte)(pcVar22[sVar24 + sVar13] - 0x30U) < 10);
        }
        multiplyRep(unit_string,sVar13,sVar24);
        sVar13 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 find(unit_string,"(1)^",sVar13,4);
        bVar7 = true;
      }
    } while (bVar7);
    sVar11 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                       (unit_string,"^1",0,2);
    while (sVar11 != 0xffffffffffffffff) {
      uVar25 = sVar11 + 2;
      if ((unit_string->_M_string_length <= uVar25) ||
         (9 < (byte)((unit_string->_M_dataplus)._M_p[uVar25] - 0x30U))) {
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::erase
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)unit_string,
                   sVar11,2);
        uVar25 = sVar11;
      }
      sVar11 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                         (unit_string,"^1",uVar25,2);
    }
    for (sVar24 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  find(unit_string,"^(1)",0,4); sVar24 != 0xffffffffffffffff;
        sVar24 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 find(unit_string,"^(1)",sVar24,4)) {
      multiplyRep(unit_string,sVar24,4);
    }
    if (unit_string->_M_string_length == 0) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                (unit_string,'1');
      return true;
    }
  }
  while ((unit_string->_M_string_length != 0 &&
         (((bVar31 = *(unit_string->_M_dataplus)._M_p, bVar31 - 0x29 < 2 || (bVar31 == 0x7d)) ||
          (bVar31 == 0x5d))))) {
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::erase
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)unit_string,0,1)
    ;
    if (unit_string->_M_string_length == 0) {
      return true;
    }
    if (*(unit_string->_M_dataplus)._M_p == '(') {
      removeOuterParenthesis(unit_string);
    }
    bVar33 = true;
  }
  uVar35 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
           find_first_of(unit_string,")]}",0,3);
  uVar25 = unit_string->_M_string_length;
  if (uVar35 < uVar25 - 1) {
    do {
      if (local_590 <= uVar35) break;
      sVar11 = uVar35 + 1;
      pcVar22 = (unit_string->_M_dataplus)._M_p;
      bVar31 = pcVar22[uVar35 + 1];
      uVar8 = (uint)bVar31;
      if (bVar31 < 0x6f) {
        if ((0x35 < uVar8 - 0x29) ||
           ((0x30000000200043U >> ((ulong)(uVar8 - 0x29) & 0x3f) & 1) == 0)) goto LAB_0040f569;
LAB_0040f4bc:
        uVar35 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 find_first_of(unit_string,")]}",sVar11,3);
      }
      else {
        if (bVar31 == 0x7d) goto LAB_0040f4bc;
        if (uVar8 == 0x7b) {
          if (pcVar22[uVar35] == '}') goto LAB_0040f569;
          goto LAB_0040f4bc;
        }
        if (uVar8 != 0x6f) {
LAB_0040f569:
          if (pcVar22[uVar35 - 1] != '\\') {
            CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            insert((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)unit_string,
                   sVar11,1,'*');
            sVar11 = uVar35 + 2;
          }
          goto LAB_0040f4bc;
        }
        uVar36 = uVar35 + 3;
        if (uVar25 <= uVar36) {
LAB_0040f541:
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          insert((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)unit_string,
                 uVar35 + 1,1,'*');
          sVar11 = uVar35 + 3;
          goto LAB_0040f4bc;
        }
        bVar7 = true;
        if (((pcVar22[uVar35 + 2] == 'f') && (cVar20 = pcVar22[uVar36], cVar20 != ')')) &&
           ((cVar20 != ']' && (cVar20 != '}')))) {
          uVar35 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                   find_first_of(unit_string,")]}",uVar36,3);
          bVar7 = false;
        }
        if (bVar7) goto LAB_0040f541;
      }
      uVar25 = unit_string->_M_string_length;
    } while (uVar35 < uVar25 - 1);
  }
  if (uVar25 == 0) {
    uVar25 = 0xffffffffffffffff;
  }
  else {
    pcVar22 = (unit_string->_M_dataplus)._M_p;
    pvVar15 = memchr(pcVar22,0x5e,uVar25);
    uVar25 = -(ulong)(pvVar15 == (void *)0x0) | (long)pvVar15 - (long)pcVar22;
  }
  sVar13 = unit_string->_M_string_length;
  uVar35 = sVar13 - 3;
  if ((uVar25 < uVar35) && (uVar25 < local_590)) {
    do {
      pcVar22 = (unit_string->_M_dataplus)._M_p;
      uVar36 = uVar25 + 1;
      if (pcVar22[uVar25 + 1] != '-') {
        uVar36 = uVar25;
      }
      if (uVar36 < uVar35) {
        uVar25 = 1;
        if ((byte)(pcVar22[uVar36 + 1] - 0x30U) < 10) {
          lVar30 = 0;
          do {
            if (sVar13 - 1 < uVar36 + 1 + lVar30) break;
            lVar6 = lVar30 + uVar36 + 2;
            lVar30 = lVar30 + 1;
          } while ((byte)(pcVar22[lVar6] - 0x30U) < 10);
          uVar25 = lVar30 + 1;
        }
        uVar35 = uVar25 + uVar36;
        if (1 < uVar25 && uVar35 <= sVar13 - 1) {
          uVar8 = (byte)pcVar22[uVar35] - 0x2a;
          if (((0x3b < uVar8) || ((0x810000008000021U >> ((ulong)uVar8 & 0x3f) & 1) == 0)) &&
             (pcVar22[uVar35] != 0)) {
            CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            insert((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)unit_string,
                   uVar35,1,'*');
          }
        }
        if (sVar13 - 1 < uVar35) break;
      }
      uVar36 = uVar36 + 2;
      uVar25 = 0xffffffffffffffff;
      sVar12 = unit_string->_M_string_length - uVar36;
      if (uVar36 <= unit_string->_M_string_length && sVar12 != 0) {
        pcVar22 = (unit_string->_M_dataplus)._M_p;
        pvVar15 = memchr(pcVar22 + uVar36,0x5e,sVar12);
        uVar25 = -(ulong)(pvVar15 == (void *)0x0) | (long)pvVar15 - (long)pcVar22;
      }
      sVar13 = unit_string->_M_string_length;
      uVar35 = sVar13 - 3;
      if ((uVar35 <= uVar25) || (local_590 <= uVar25)) break;
    } while( true );
  }
  if ((unit_string->_M_string_length != 0) && (*(unit_string->_M_dataplus)._M_p == '/')) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace_aux
              (unit_string,0,0,1,'1');
    bVar33 = true;
  }
  if ((match_flags >> 0x24 & 1) == 0) {
    if (unit_string->_M_string_length == 0) {
      pcVar22 = (pointer)0xffffffffffffffff;
    }
    else {
      pcVar22 = (unit_string->_M_dataplus)._M_p;
      pvVar15 = memchr(pcVar22,0x7b,unit_string->_M_string_length);
      pcVar22 = (pointer)(-(ulong)(pvVar15 == (void *)0x0) | (long)pvVar15 - (long)pcVar22);
    }
    while (pcVar26 = pcVar22, pcVar26 != (pointer)0xffffffffffffffff) {
      local_570[0].first._M_dataplus._M_p = pcVar26 + 1;
      bVar7 = segmentcheck(unit_string,'}',(size_t *)local_570);
      pcVar22 = (pointer)0xffffffffffffffff;
      if (bVar7) {
        pcVar5 = (unit_string->_M_dataplus)._M_p;
        if (pcVar26 + (long)(pcVar5 + 1) !=
            local_570[0].first._M_dataplus._M_p + (long)(pcVar5 + -1)) {
          pcVar34 = local_570[0].first._M_dataplus._M_p + -2;
          do {
            iVar9 = tolower((int)pcVar26[(long)(pcVar5 + 1)]);
            pcVar26[(long)(pcVar5 + 1)] = (char)iVar9;
            pcVar26 = pcVar26 + 1;
          } while (pcVar34 != pcVar26);
        }
        sVar12 = (long)unit_string->_M_string_length - (long)local_570[0].first._M_dataplus._M_p;
        if (local_570[0].first._M_dataplus._M_p <= (pointer)unit_string->_M_string_length &&
            sVar12 != 0) {
          pcVar22 = (unit_string->_M_dataplus)._M_p;
          pvVar15 = memchr(local_570[0].first._M_dataplus._M_p + (long)pcVar22,0x7b,sVar12);
          pcVar22 = (pointer)(-(ulong)(pvVar15 == (void *)0x0) | (long)pvVar15 - (long)pcVar22);
        }
      }
    }
  }
  if (!bVar33) {
    return unit_string->_M_string_length != local_578;
  }
  return true;
}

Assistant:

static bool cleanUnitString(std::string& unit_string, std::uint64_t match_flags)
{
    auto slen = unit_string.size();
    bool skipcodereplacement = ((match_flags & skip_code_replacements) != 0);
    static UNITS_CPP14_CONSTEXPR_OBJECT std::array<ckpair, 4>
        earlyCodeReplacements{{
            ckpair{"degree", "deg"},
            ckpair{"Degree", "deg"},
            ckpair{"degs ", "deg"},
            ckpair{"deg ", "deg"},
        }};

    static UNITS_CPP14_CONSTEXPR_OBJECT std::array<ckpair, 33>
        allCodeReplacements{{
            ckpair{"sq.", "square"},
            ckpair{"cu.", "cubic"},
            ckpair{"U.S.", "US"},
            ckpair{"10^", "1e"},
            ckpair{"10-", "1e-"},
            ckpair{"^+", "^"},
            ckpair{"'s", "s"},
            ckpair{"ampere", "amp"},
            ckpair{"Ampere", "amp"},
            ckpair{"metre", "meter"},
            ckpair{"Metre", "meter"},
            ckpair{"litre", "liter"},
            ckpair{"Litre", "liter"},
            ckpair{"B.Th.U.", "BTU"},
            ckpair{"B.T.U.", "BTU"},
            ckpair{"Britishthermalunits", "BTU"},
            ckpair{"Britishthermalunitat", "BTU"},
            ckpair{"Britishthermalunit", "BTU"},
            ckpair{"BThU", "BTU"},
            ckpair{"-US", "US"},
            ckpair{"--", "*"},
            // -- is either a double negative or a separator, so make it a
            // multiplier so it doesn't get erased and then converted to a
            // power
            ckpair{"\\\\", "\\\\*"},
            // \\ is always considered a segment terminator so it won't be
            // misinterpreted as a known escape sequence
            ckpair{"perunit", "pu"},
            ckpair{"percent", "%"},
            ckpair{"per-unit", "pu"},
            ckpair{"per unit ", "pu"},
            ckpair{"/square*", "/square"},
            ckpair{"/cubic*", "/cubic"},
            ckpair{"Hz^0.5", "rootHertz"},
            ckpair{"Hz^.5", "rootHertz"},
            ckpair{"Hz^(1/2)", "rootHertz"},
            ckpair{"Hz^1/2", "rootHertz"},
            ckpair{u8"\u221AHz", "rootHertz"},
        }};

    static const std::string spchar = std::string(" \t\n\r") + '\0';
    bool changed = false;
    bool skipMultiply = false;
    std::size_t skipMultiplyInsertionAfter{std::string::npos};
    char tail = unit_string.back();
    if (tail == '^' || tail == '*' || tail == '/') {
        unit_string.pop_back();
        changed = true;
    }
    auto c = unit_string.find_first_not_of(spchar);
    if (c == std::string::npos) {
        unit_string.clear();
        return true;
    }
    if (c != 0) {
        unit_string.erase(0, c);
        c = unit_string.find_first_not_of(spchar);
        changed = true;
    }
    if (unit_string[c] == '/') {
        unit_string.insert(c, 1, '1');
        changed = true;
        skipMultiply = true;
    }
    if (!skipcodereplacement) {
        // Check for unicode or extended characters
        if (std::any_of(unit_string.begin(), unit_string.end(), [](char x) {
                return (static_cast<std::uint8_t>(x) & 0x80U) != 0;
            })) {
            if (unicodeReplacement(unit_string)) {
                changed = true;
            }
        }

        // some code replacement that needs to be done before single character
        // and space replacements
        for (const auto& acode : earlyCodeReplacements) {
            auto fnd = unit_string.find(acode.first);
            while (fnd != std::string::npos) {
                changed = true;
                unit_string.replace(fnd, strlen(acode.first), acode.second);
                fnd = unit_string.find(acode.first, fnd + 1);
            }
        }

        if (unit_string.find_first_of(spchar) != std::string::npos) {
            // deal with some particular string with a space in them
            std::size_t reploc{0};
            // clean up some "per" words
            if (unit_string.compare(0, 4, "per ") == 0) {
                reploc = 2;
                unit_string.replace(0, 4, "1/");
                skipMultiply = true;
            }
            if (ReplaceStringInPlace(unit_string, " per ", 5, "/", 1, reploc)) {
                skipMultiply = true;
            }
            if (reploc > 0) {
                auto ploc = unit_string.find_first_of('(', reploc);
                if (ploc != std::string::npos) {
                    auto fdiv = unit_string.find_first_of('/', reploc);
                    std::size_t ndiv{0};
                    do {
                        ndiv = unit_string.find_first_of('/', fdiv + 1);
                        if (ploc < ndiv) {
                            if (ndiv != std::string::npos) {
                                unit_string.insert(ndiv, 1, ')');
                            } else {
                                unit_string.push_back(')');
                            }
                            unit_string.insert(fdiv + 1, 1, '(');
                            fdiv = ndiv + 2;
                        } else {
                            fdiv = ndiv;
                        }
                    } while (ndiv != std::string::npos);
                }
            }
            checkShortUnits(unit_string, match_flags);
            auto fndP = unit_string.find(" of ");
            while (fndP != std::string::npos) {
                auto nchar = unit_string.find_first_not_of(spchar, fndP + 4);
                if (nchar != std::string::npos) {
                    if (unit_string[nchar] == '(' ||
                        unit_string[nchar] == '[') {
                        skipMultiplyInsertionAfter = fndP;
                        break;
                    }
                }
                fndP = unit_string.find(" of ", fndP + 3);
            }
            changed |= cleanSpaces(unit_string, skipMultiply);
            if (unit_string.empty()) {
                // LCOV_EXCL_START
                return true;
                // LCOV_EXCL_STOP
            }
        }

        checkPowerOf10(unit_string);
    } else {
        auto fndP = unit_string.find("of(");
        if (fndP != std::string::npos) {
            skipMultiplyInsertionAfter = fndP;
        }
    }
    if (unit_string.front() == '(') {
        removeOuterParenthesis(unit_string);
        if (unit_string.empty()) {
            return true;
        }
    }

    if (!skipcodereplacement) {
        // ** means power in some environments
        std::size_t loc{0};
        if (ReplaceStringInPlace(unit_string, "**", 2, "^", 1, loc)) {
            changed = true;
        }
    }
    if ((match_flags & case_insensitive) != 0) {
        ciConversion(unit_string);
        changed = true;
    }
    if (!skipcodereplacement) {
        // deal with some html stuff
        auto bloc = unit_string.find_last_of('<');
        if (bloc != std::string::npos) {
            htmlCodeReplacement(unit_string);
        }
        // some abbreviations and other problematic code replacements
        for (const auto& acode : allCodeReplacements) {
            auto fnd = unit_string.find(acode.first);
            while (fnd != std::string::npos) {
                changed = true;
                unit_string.replace(fnd, strlen(acode.first), acode.second);
                fnd = unit_string.find(acode.first, fnd + 1);
            }
        }
    }
    if (unit_string.size() >= 2) {
        auto eit = unit_string.end() - 1;
        if (*(eit) == '2' || *(eit) == '3') {
            if ((*(eit - 1) == '-' || *(eit - 1) == '+') &&
                unit_string.size() >= 3) {
                --eit;
            }
            if (!isDigitCharacter(*(eit - 1))) {
                switch (*(eit - 1)) {
                    case '^':
                    case 'e':
                    case 'E':
                    case '/':
                    case '+':
                    case '-':
                    case '.':
                        break;
                    case '*':
                        *(eit - 1) = '^';
                        break;
                    default:
                        if (eit[0] != '+') {
                            unit_string.insert(eit, '^');
                        } else {
                            *eit = '^';
                        }

                        break;
                }
            }
        }
    }
    if (!skipcodereplacement) {
        // handle dot notation for multiplication
        auto dotloc = unit_string.find_last_of('.');
        if (dotloc < std::string::npos) {
            // strings always have a null pointer at the end
            if (!isDigitCharacter(unit_string[dotloc + 1])) {
                cleanDotNotation(unit_string, match_flags);
                changed = true;
            }
        }

        // clear empty parenthesis
        auto fndP = unit_string.find("()");
        while (fndP != std::string::npos) {
            if (unit_string.size() > fndP + 2) {
                if (unit_string[fndP + 2] == '^') {
                    unit_string.replace(fndP, 2, "*1");
                } else {
                    unit_string.erase(fndP, 2);
                }
            } else {
                unit_string.erase(fndP, 2);
            }
            fndP = unit_string.find("()", fndP);
        }
        // clear empty brackets, this would indicate commodities but if
        // empty there is no commodity
        clearEmptySegments(unit_string);
        cleanUpPowersOfOne(unit_string);
        if (unit_string.empty()) {
            unit_string.push_back('1');
            return true;
        }
    }
    // remove leading *})],  equivalent of 1* but we don't need to process
    // that further
    while (!unit_string.empty() &&
           (unit_string.front() == '*' || unit_string.front() == '}' ||
            unit_string.front() == ')' || unit_string.front() == ']')) {
        unit_string.erase(0, 1);
        changed = true;
        if (unit_string.empty()) {
            return true;
        }
        // check for parenthesis again
        if (unit_string.front() == '(') {
            removeOuterParenthesis(unit_string);
        }
    }
    // inject multiplies after bracket terminators
    auto fnd = unit_string.find_first_of(")]}");
    while (fnd < unit_string.size() - 1 && fnd < skipMultiplyInsertionAfter) {
        switch (unit_string[fnd + 1]) {
            case '^':
            case '*':
            case '/':
            case ')':
            case ']':
            case '}':
            case '>':
                fnd = unit_string.find_first_of(")]}", fnd + 1);
                break;
            case 'o':  // handle special case of commodity modifier using
                       // "of"
                if (unit_string.size() > fnd + 3) {
                    auto tc2 = unit_string[fnd + 3];
                    if (unit_string[fnd + 2] == 'f' && tc2 != ')' &&
                        tc2 != ']' && tc2 != '}') {
                        fnd = unit_string.find_first_of(")]}", fnd + 3);
                        break;
                    }
                }
                unit_string.insert(fnd + 1, 1, '*');
                fnd = unit_string.find_first_of(")]}", fnd + 3);
                break;
            case '{':
                if (unit_string[fnd] != '}') {
                    fnd = unit_string.find_first_of(")]}", fnd + 1);
                    break;
                }
                /* FALLTHRU */
            default:
                if (unit_string[fnd - 1] == '\\') {  // ignore escape sequences
                    fnd = unit_string.find_first_of(")]}", fnd + 1);
                    break;
                }
                unit_string.insert(fnd + 1, 1, '*');
                fnd = unit_string.find_first_of(")]}", fnd + 2);
                break;
        }
    }
    // insert multiplies after ^#
    fnd = unit_string.find_first_of('^');
    while (fnd < unit_string.size() - 3 && fnd < skipMultiplyInsertionAfter) {
        if (unit_string[fnd + 1] == '-') {
            ++fnd;
        }
        if (fnd < unit_string.size() - 3) {
            std::size_t seq = 1;
            auto p = unit_string[fnd + seq];
            while (p >= '0' && p <= '9' &&
                   fnd + seq <= unit_string.size() - 1U) {
                ++seq;
                p = unit_string[fnd + seq];
            }
            if (fnd + seq > unit_string.size() - 1U) {
                break;
            }
            if (seq > 1) {
                auto c2 = unit_string[fnd + seq];
                if (c2 != '\0' && c2 != '*' && c2 != '/' && c2 != '^' &&
                    c2 != 'e' && c2 != 'E') {
                    unit_string.insert(fnd + seq, 1, '*');
                }
            }
        }
        fnd = unit_string.find_first_of('^', fnd + 2);
    }

    // this still might occur from code replacements or other removal
    if (!unit_string.empty() && unit_string.front() == '/') {
        unit_string.insert(unit_string.begin(), '1');
        changed = true;
    }
    if (!skipcodereplacement) {  // make everything inside {} lower case
        auto bloc = unit_string.find_first_of('{');
        while (bloc != std::string::npos) {
            auto ind = bloc + 1;
            if (segmentcheck(unit_string, '}', ind)) {
                std::transform(
                    unit_string.begin() + bloc + 1,
                    unit_string.begin() + ind - 1,
                    unit_string.begin() + bloc + 1,
                    ::tolower);
                bloc = unit_string.find_first_of('{', ind);
            } else {
                bloc = std::string::npos;
            }
        }
    }
    return (changed || unit_string.size() != slen);
}